

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O2

Amap_Cut_t * Amap_ManCutCreate(Amap_Man_t *p,Amap_Cut_t *pCut0,Amap_Cut_t *pCut1,int iMat)

{
  Amap_Cut_t *pAVar1;
  ulong uVar2;
  Amap_Cut_t **ppAVar3;
  uint Entry;
  int iVar4;
  Amap_Cut_t AVar5;
  
  if (((uint)*pCut1 & 0xffff) <= ((uint)*pCut0 & 0xffff)) {
    iVar4 = ((uint)*pCut1 >> 0x11) + ((uint)*pCut0 >> 0x11);
    pAVar1 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemTemp,iVar4 * 4 + 0xc);
    Entry = iMat & 0xffff;
    AVar5 = (Amap_Cut_t)(iVar4 * 0x20000 | Entry);
    *pAVar1 = AVar5;
    for (uVar2 = 0; uVar2 < (uint)*pCut0 >> 0x11; uVar2 = uVar2 + 1) {
      pAVar1[uVar2 + 1] = pCut0[uVar2 + 1];
    }
    for (uVar2 = 0; uVar2 < (uint)*pCut1 >> 0x11; uVar2 = uVar2 + 1) {
      pAVar1[((uint)*pCut0 >> 0x11) + uVar2 + 1] = pCut1[uVar2 + 1];
    }
    ppAVar3 = p->ppCutsTemp;
    if (ppAVar3[Entry] == (Amap_Cut_t *)0x0) {
      Vec_IntPushOrder(p->vTemp,Entry);
      ppAVar3 = p->ppCutsTemp;
      AVar5 = *pAVar1;
      Entry = (uint)AVar5 & 0xffff;
    }
    *(undefined8 *)(pAVar1 + (ulong)((uint)AVar5 >> 0x11) + 1) =
         *(undefined8 *)((long)ppAVar3 + (ulong)(Entry << 3));
    *(Amap_Cut_t **)((long)p->ppCutsTemp + (ulong)(Entry << 3)) = pAVar1;
    return pAVar1;
  }
  __assert_fail("pCut0->iMat >= pCut1->iMat",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMerge.c"
                ,0x6f,"Amap_Cut_t *Amap_ManCutCreate(Amap_Man_t *, Amap_Cut_t *, Amap_Cut_t *, int)"
               );
}

Assistant:

Amap_Cut_t * Amap_ManCutCreate( Amap_Man_t * p, 
    Amap_Cut_t * pCut0, Amap_Cut_t * pCut1, int iMat )
{
    Amap_Cut_t * pCut;
    int i, nSize  = pCut0->nFans + pCut1->nFans;
    int nBytes = sizeof(Amap_Cut_t) + sizeof(int) * nSize + sizeof(Amap_Cut_t *);
    assert( pCut0->iMat >= pCut1->iMat );
    pCut = (Amap_Cut_t *)Aig_MmFlexEntryFetch( p->pMemTemp, nBytes );
    pCut->iMat  = iMat;
    pCut->fInv  = 0;
    pCut->nFans = nSize;
    for ( i = 0; i < (int)pCut0->nFans; i++ )
        pCut->Fans[i] = pCut0->Fans[i];
    for ( i = 0; i < (int)pCut1->nFans; i++ )
        pCut->Fans[pCut0->nFans+i] = pCut1->Fans[i];
    // add it to storage
    if ( p->ppCutsTemp[ pCut->iMat ] == NULL )
        Vec_IntPushOrder( p->vTemp, pCut->iMat );
    *Amap_ManCutNextP( pCut ) = p->ppCutsTemp[ pCut->iMat ];
    p->ppCutsTemp[ pCut->iMat ] = pCut;
    return pCut;
}